

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

ostream * helics::operator<<(ostream *out,ActionMessage *command)

{
  ActionMessage *in_RDX;
  string local_30;
  
  prettyPrintString_abi_cxx11_(&local_30,(helics *)command,in_RDX);
  std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ActionMessage& command)
{
    out << prettyPrintString(command);
    return out;
}